

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_TtPrintHexRev(FILE *pFile,word *pTruth,int nVars)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int __c;
  uint uVar4;
  ulong *puVar5;
  
  if (nVars < 2) {
    __assert_fail("nVars >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                  ,0x360,"void Abc_TtPrintHexRev(FILE *, word *, int)");
  }
  iVar3 = 1 << ((char)nVars - 6U & 0x1f);
  if ((uint)nVars < 7) {
    iVar3 = 1;
  }
  puVar5 = pTruth + iVar3;
  uVar4 = 0xf;
  if ((uint)nVars < 6) {
    uVar4 = ~(-1 << ((char)nVars - 2U & 0x1f));
  }
  while (puVar5 = puVar5 + -1, iVar3 = uVar4 * 4, uVar1 = uVar4, pTruth <= puVar5) {
    for (; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
      uVar2 = (uint)(*puVar5 >> ((byte)iVar3 & 0x3f)) & 0xf;
      __c = uVar2 + 0x30;
      if (9 < uVar2) {
        __c = uVar2 + 0x37;
      }
      fputc(__c,(FILE *)pFile);
      iVar3 = iVar3 + -4;
    }
  }
  return;
}

Assistant:

static inline void Abc_TtPrintHexRev( FILE * pFile, word * pTruth, int nVars )
{
    word * pThis;
    int k, StartK = nVars >= 6 ? 16 : (1 << (nVars - 2));
    assert( nVars >= 2 );
    for ( pThis = pTruth + Abc_TtWordNum(nVars) - 1; pThis >= pTruth; pThis-- )
        for ( k = StartK - 1; k >= 0; k-- )
            fprintf( pFile, "%c", Abc_TtPrintDigit((int)(pThis[0] >> (k << 2)) & 15) );
//    printf( "\n" );
}